

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O2

void __thiscall
embree::sse2::FeatureAdaptiveEvalGrid::eval
          (FeatureAdaptiveEvalGrid *this,CatmullClarkPatch3fa *patch,BBox2f *srange,BBox2f *erange,
          uint depth,BezierCurve3fa *border0,BezierCurve3fa *border1,BezierCurve3fa *border2,
          BezierCurve3fa *border3)

{
  float *pfVar1;
  float fVar2;
  anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 aVar3;
  int iVar4;
  float fVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  int lx0;
  ssize_t numCreases;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int ly0;
  size_t i_2;
  size_t i_3;
  int ly1;
  int lx1;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  BBox2f srange3;
  BBox2f srange1;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> patches;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34d0;
  uint uStack_34c8;
  uint uStack_34c4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34c0;
  float fStack_34b8;
  float fStack_34b4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34b0;
  float fStack_34a8;
  float fStack_34a4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34a0;
  float fStack_3498;
  float fStack_3494;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_3490;
  undefined8 uStack_3488;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> local_3480;
  
  lVar11 = 2;
  while (lVar11 != 4) {
    fVar2 = *(float *)((long)erange + lVar11 * 4 + -8);
    pfVar1 = (erange->lower).field_0.components + lVar11;
    lVar11 = lVar11 + 1;
    if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
      return;
    }
  }
  fVar2 = (erange->upper).field_0.field_0.x;
  fVar22 = ceilf((erange->lower).field_0.field_0.x);
  fVar23 = ceilf(fVar2);
  uVar17 = 0;
  uVar18 = 0;
  if ((fVar2 == (float)this->x1) && (!NAN(fVar2) && !NAN((float)this->x1))) {
    if (fVar2 < (srange->lower).field_0.field_0.x || fVar2 == (srange->lower).field_0.field_0.x) {
      uVar18 = -(uint)(fVar2 == 0.0) & 1;
    }
    else {
      uVar18 = 1;
    }
  }
  lx1 = uVar18 + (int)fVar23;
  lx0 = (int)fVar22;
  fVar2 = (erange->upper).field_0.field_0.y;
  fVar22 = ceilf((erange->lower).field_0.field_0.y);
  fVar23 = ceilf(fVar2);
  if ((fVar2 == (float)this->y1) && (!NAN(fVar2) && !NAN((float)this->y1))) {
    pfVar1 = &(srange->lower).field_0.field_0.y;
    if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
      uVar17 = -(uint)(fVar2 == 0.0) & 1;
    }
    else {
      uVar17 = 1;
    }
  }
  if (lx1 <= lx0) {
    return;
  }
  ly1 = uVar17 + (int)fVar23;
  ly0 = (int)fVar22;
  if (ly1 <= ly0) {
    return;
  }
  uVar17 = (patch->ring).items[0].face_valence;
  uVar12 = 0;
  for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
    uVar12 = uVar12 + (0.0 < (patch->ring).items[0].crease_weight.data[uVar13]);
  }
  iVar4 = (patch->ring).items[0].border_index;
  bVar14 = uVar12 == (uint)(iVar4 != -1) * 2;
  fVar2 = (patch->ring).items[0].vertex_crease_weight;
  bVar6 = false;
  bVar7 = false;
  if (uVar17 == 2 && iVar4 != -1) {
    if (((fVar2 == 0.0) && (!NAN(fVar2))) || (INFINITY <= fVar2)) {
LAB_005e5a8b:
      bVar7 = bVar14;
      bVar6 = true;
    }
  }
  else if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    if (uVar17 == 3 && iVar4 != -1) goto LAB_005e5a8b;
    bVar6 = uVar17 == 4 && iVar4 == -1;
    bVar7 = bVar6 && bVar14;
  }
  uVar17 = (patch->ring).items[1].face_valence;
  uVar12 = 0;
  for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
    uVar12 = uVar12 + (0.0 < (patch->ring).items[1].crease_weight.data[uVar13]);
  }
  iVar4 = (patch->ring).items[1].border_index;
  bVar14 = uVar12 == (uint)(iVar4 != -1) * 2;
  bVar9 = 1;
  fVar2 = (patch->ring).items[1].vertex_crease_weight;
  if (uVar17 == 2 && iVar4 != -1) {
    if (((fVar2 != 0.0) || (NAN(fVar2))) && (fVar2 < INFINITY)) goto LAB_005e5b00;
  }
  else if ((fVar2 != 0.0) || (NAN(fVar2))) {
LAB_005e5b00:
    bVar9 = 0;
    bVar14 = false;
  }
  else if ((uVar17 != 3 || iVar4 == -1) && (uVar17 != 4 || iVar4 != -1)) {
    bVar9 = 0;
    bVar14 = false;
  }
  uVar17 = (patch->ring).items[2].face_valence;
  uVar12 = 0;
  for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
    uVar12 = uVar12 + (0.0 < (patch->ring).items[2].crease_weight.data[uVar13]);
  }
  iVar4 = (patch->ring).items[2].border_index;
  bVar15 = uVar12 == (uint)(iVar4 != -1) * 2;
  bVar10 = true;
  fVar2 = (patch->ring).items[2].vertex_crease_weight;
  if (uVar17 == 2 && iVar4 != -1) {
    if (((fVar2 != 0.0) || (NAN(fVar2))) && (fVar2 < INFINITY)) goto LAB_005e5bbd;
  }
  else if ((fVar2 != 0.0) || (NAN(fVar2))) {
LAB_005e5bbd:
    bVar10 = false;
    bVar15 = false;
  }
  else if (uVar17 != 3 || iVar4 == -1) {
    bVar10 = uVar17 == 4 && iVar4 == -1;
    bVar15 = (uVar17 == 4 && iVar4 == -1) && bVar15;
  }
  uVar17 = (patch->ring).items[3].face_valence;
  uVar12 = 0;
  for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
    uVar12 = uVar12 + (0.0 < (patch->ring).items[3].crease_weight.data[uVar13]);
  }
  iVar4 = (patch->ring).items[3].border_index;
  bVar16 = uVar12 == (uint)(iVar4 != -1) * 2;
  bVar8 = 1;
  fVar2 = (patch->ring).items[3].vertex_crease_weight;
  if (uVar17 == 2 && iVar4 != -1) {
    if (((fVar2 == 0.0) && (!NAN(fVar2))) || (INFINITY <= fVar2)) goto LAB_005e5cb1;
  }
  else if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    bVar8 = 1;
    if ((uVar17 != 3 || iVar4 == -1) && (uVar17 != 4 || iVar4 != -1)) {
      bVar8 = 0;
      bVar16 = false;
    }
    goto LAB_005e5cb1;
  }
  bVar16 = false;
  bVar8 = 0;
LAB_005e5cb1:
  if (depth < 10) {
    if (!(bool)(bVar14 & bVar7 & bVar15 & bVar16)) {
      array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL>::array_t(&local_3480)
      ;
      CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide(patch,&local_3480);
      local_3490.field_0 = (srange->lower).field_0.field_0;
      fVar28 = local_3490.field_0.x;
      fVar29 = local_3490.field_0.y;
      aVar3 = (srange->upper).field_0.field_0;
      fVar24 = aVar3.x;
      fVar25 = aVar3.y;
      fVar26 = (fVar28 + fVar24) * 0.5;
      fVar27 = (fVar29 + fVar25) * 0.5;
      uStack_3488 = CONCAT44(fVar27,fVar26);
      fVar2 = (erange->lower).field_0.field_0.x;
      fVar22 = (erange->lower).field_0.field_0.y;
      fVar23 = (erange->upper).field_0.field_0.x;
      fVar5 = (erange->upper).field_0.field_0.y;
      uVar17 = -(uint)(fVar28 < fVar2);
      uVar18 = -(uint)(fVar29 < fVar22);
      uVar19 = -(uint)(fVar26 < fVar23);
      uVar20 = -(uint)(fVar27 < fVar5);
      local_34d0.field_0.x = (float)(~uVar17 & (uint)fVar28 | (uint)fVar2 & uVar17);
      local_34d0.field_0.y = (float)(~uVar18 & (uint)fVar29 | (uint)fVar22 & uVar18);
      uStack_34c8 = ~uVar19 & (uint)fVar23 | (uint)fVar26 & uVar19;
      uStack_34c4 = ~uVar20 & (uint)fVar5 | (uint)fVar27 & uVar20;
      uVar17 = depth + 1;
      local_34c0.field_0.x = fVar26;
      local_34c0.field_0.y = fVar27;
      fStack_34b8 = fVar24;
      fStack_34b4 = fVar25;
      local_34b0.field_0.x = fVar28;
      local_34b0.field_0.y = fVar27;
      fStack_34a8 = fVar26;
      fStack_34a4 = fVar25;
      local_34a0.field_0.x = fVar26;
      local_34a0.field_0.y = fVar29;
      fStack_3498 = fVar24;
      fStack_3494 = fVar27;
      eval(this,local_3480.items,(BBox2f *)&local_3490.field_0,(BBox2f *)&local_34d0.field_0,uVar17,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
      fVar2 = (erange->lower).field_0.field_0.x;
      fVar22 = (erange->lower).field_0.field_0.y;
      fVar23 = (erange->upper).field_0.field_0.x;
      fVar5 = (erange->upper).field_0.field_0.y;
      uVar18 = -(uint)(fVar26 < fVar2);
      uVar19 = -(uint)(fVar29 < fVar22);
      uVar20 = -(uint)(fVar24 < fVar23);
      uVar21 = -(uint)(fVar27 < fVar5);
      local_34d0.field_0.x = (float)(~uVar18 & (uint)fVar26 | (uint)fVar2 & uVar18);
      local_34d0.field_0.y = (float)(~uVar19 & (uint)fVar29 | (uint)fVar22 & uVar19);
      uStack_34c8 = ~uVar20 & (uint)fVar23 | (uint)fVar24 & uVar20;
      uStack_34c4 = ~uVar21 & (uint)fVar5 | (uint)fVar27 & uVar21;
      eval(this,local_3480.items + 1,(BBox2f *)&local_34a0.field_0,(BBox2f *)&local_34d0.field_0,
           uVar17,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
           (BezierCurve3fa *)0x0);
      fVar2 = (erange->lower).field_0.field_0.x;
      fVar22 = (erange->lower).field_0.field_0.y;
      fVar23 = (erange->upper).field_0.field_0.x;
      fVar5 = (erange->upper).field_0.field_0.y;
      uVar18 = -(uint)(fVar26 < fVar2);
      uVar19 = -(uint)(fVar27 < fVar22);
      uVar20 = -(uint)(fVar24 < fVar23);
      uVar21 = -(uint)(fVar25 < fVar5);
      local_34d0.field_0.x = (float)(~uVar18 & (uint)fVar26 | (uint)fVar2 & uVar18);
      local_34d0.field_0.y = (float)(~uVar19 & (uint)fVar27 | (uint)fVar22 & uVar19);
      uStack_34c8 = ~uVar20 & (uint)fVar23 | (uint)fVar24 & uVar20;
      uStack_34c4 = ~uVar21 & (uint)fVar5 | (uint)fVar25 & uVar21;
      eval(this,local_3480.items + 2,(BBox2f *)&local_34c0.field_0,(BBox2f *)&local_34d0.field_0,
           uVar17,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
           (BezierCurve3fa *)0x0);
      fVar2 = (erange->lower).field_0.field_0.x;
      fVar22 = (erange->lower).field_0.field_0.y;
      fVar23 = (erange->upper).field_0.field_0.x;
      fVar5 = (erange->upper).field_0.field_0.y;
      uVar18 = -(uint)(fVar28 < fVar2);
      uVar19 = -(uint)(fVar27 < fVar22);
      uVar20 = -(uint)(fVar26 < fVar23);
      uVar21 = -(uint)(fVar25 < fVar5);
      local_34d0.field_0.x = (float)(~uVar18 & (uint)fVar28 | (uint)fVar2 & uVar18);
      local_34d0.field_0.y = (float)(~uVar19 & (uint)fVar27 | (uint)fVar22 & uVar19);
      uStack_34c8 = ~uVar20 & (uint)fVar23 | (uint)fVar26 & uVar20;
      uStack_34c4 = ~uVar21 & (uint)fVar5 | (uint)fVar25 & uVar21;
      eval(this,local_3480.items + 3,(BBox2f *)&local_34b0.field_0,(BBox2f *)&local_34d0.field_0,
           uVar17,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
           (BezierCurve3fa *)0x0);
      array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL>::~array_t
                (&local_3480);
      return;
    }
  }
  else if (!(bool)(bVar9 & bVar6 & bVar10 & bVar8)) {
    GregoryPatchT<embree::Vec3fa,_embree::Vec3fa>::init_crackfix
              ((GregoryPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,patch,border0,border1,
               border2,border3);
    evalLocalGrid<embree::GregoryPatchT<embree::Vec3fa,embree::Vec3fa>>
              (this,(GregoryPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,srange,lx0,lx1,ly0,
               ly1);
    return;
  }
  BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
            ((BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,(EVP_PKEY_CTX *)patch);
  evalLocalGrid<embree::BSplinePatchT<embree::Vec3fa,embree::Vec3fa>>
            (this,(BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,srange,lx0,lx1,ly0,
             ly1);
  return;
}

Assistant:

void eval(const CatmullClarkPatch3fa& patch, const BBox2f& srange, const BBox2f& erange, const unsigned depth, 
                const BezierCurve3fa* border0 = nullptr, const BezierCurve3fa* border1 = nullptr, const BezierCurve3fa* border2 = nullptr, const BezierCurve3fa* border3 = nullptr)
      {
        if (erange.empty())
          return;
        
        int lx0 = (int) ceilf(erange.lower.x);
        int lx1 = (int) ceilf(erange.upper.x) + (erange.upper.x == x1 && (srange.lower.x < erange.upper.x || erange.upper.x == 0));
        int ly0 = (int) ceilf(erange.lower.y);
        int ly1 = (int) ceilf(erange.upper.y) + (erange.upper.y == y1 && (srange.lower.y < erange.upper.y || erange.upper.y == 0));
        if (lx0 >= lx1 || ly0 >= ly1) return;

        CatmullClarkPatch::Type ty = patch.type();

        if (unlikely(final(patch,ty,depth)))
        {
          if (ty & CatmullClarkRing::TYPE_REGULAR) {
            RegularPatch rpatch(patch,border0,border1,border2,border3);
            evalLocalGrid(rpatch,srange,lx0,lx1,ly0,ly1);
            return;
          } else {
            IrregularFillPatch ipatch(patch,border0,border1,border2,border3);
            evalLocalGrid(ipatch,srange,lx0,lx1,ly0,ly1);
            return;
          }
        }
        else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
          assert(depth > 0); 
          RegularPatch rpatch(patch,border0,border1,border2,border3);
          evalLocalGrid(rpatch,srange,lx0,lx1,ly0,ly1);
          return;
        }
#if PATCH_USE_GREGORY == 2
        else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
          assert(depth > 0); 
          GregoryPatch gpatch(patch,border0,border1,border2,border3);
          evalLocalGrid(gpatch,srange,lx0,lx1,ly0,ly1);
        }
#endif
        else
        {
          array_t<CatmullClarkPatch3fa,4> patches; 
          patch.subdivide(patches);
          
          const Vec2f c = srange.center();
          const BBox2f srange0(srange.lower,c);
          const BBox2f srange1(Vec2f(c.x,srange.lower.y),Vec2f(srange.upper.x,c.y));
          const BBox2f srange2(c,srange.upper);
          const BBox2f srange3(Vec2f(srange.lower.x,c.y),Vec2f(c.x,srange.upper.y));
          
          eval(patches[0],srange0,intersect(srange0,erange),depth+1);
          eval(patches[1],srange1,intersect(srange1,erange),depth+1);
          eval(patches[2],srange2,intersect(srange2,erange),depth+1);
          eval(patches[3],srange3,intersect(srange3,erange),depth+1);
        }